

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

GCcdata * argv2cdata(jit_State *J,TRef tr,cTValue *o)

{
  undefined2 uVar1;
  TRef k;
  TRef TVar2;
  jit_State *J_00;
  uint *in_RDX;
  uint in_ESI;
  long in_RDI;
  TRef trtypeid;
  GCcdata *cd;
  TraceError in_stack_ffffffffffffffac;
  jit_State *in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffba;
  undefined4 in_stack_ffffffffffffffbc;
  
  if ((in_ESI & 0x1f000000) != 0xa000000) {
    lj_trace_err(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  J_00 = (jit_State *)(ulong)*in_RDX;
  *(undefined2 *)(in_RDI + 0x9c) = 0x4312;
  *(short *)(in_RDI + 0x98) = (short)in_ESI;
  *(undefined2 *)(in_RDI + 0x9a) = 0xc;
  k = lj_opt_fold((jit_State *)
                  CONCAT44(in_stack_ffffffffffffffbc,
                           CONCAT22(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8)));
  uVar1 = (undefined2)k;
  TVar2 = lj_ir_kint(J_00,k);
  *(undefined2 *)(in_RDI + 0x9c) = 0x893;
  *(undefined2 *)(in_RDI + 0x98) = uVar1;
  *(short *)(in_RDI + 0x9a) = (short)TVar2;
  lj_opt_fold((jit_State *)CONCAT44(k,CONCAT22(uVar1,in_stack_ffffffffffffffb8)));
  return (GCcdata *)J_00;
}

Assistant:

static GCcdata *argv2cdata(jit_State *J, TRef tr, cTValue *o)
{
  GCcdata *cd;
  TRef trtypeid;
  if (!tref_iscdata(tr))
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  cd = cdataV(o);
  /* Specialize to the CTypeID. */
  trtypeid = emitir(IRT(IR_FLOAD, IRT_U16), tr, IRFL_CDATA_CTYPEID);
  emitir(IRTG(IR_EQ, IRT_INT), trtypeid, lj_ir_kint(J, (int32_t)cd->ctypeid));
  return cd;
}